

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reference_values.cxx
# Opt level: O0

pair<int,_std::vector<double,_std::allocator<double>_>_> * load_reference_density(Spin s)

{
  int in_ESI;
  pair<int,_std::vector<double,_std::allocator<double>_>_> *in_RDI;
  int npts;
  vector<double,_std::allocator<double>_> ref_rho;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff88;
  back_insert_iterator<std::vector<double,_std::allocator<double>_>_> in_stack_ffffffffffffff90;
  back_insert_iterator<std::vector<double,_std::allocator<double>_>_> in_stack_ffffffffffffff98;
  pair<int,_std::vector<double,_std::allocator<double>_>_> *dest;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffb0;
  
  dest = in_RDI;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x187664);
  if (in_ESI == 0) {
    std::vector<double,_std::allocator<double>_>::size(&rho_polarized);
    in_stack_ffffffffffffff98 =
         std::back_inserter<std::vector<double,std::allocator<double>>>(in_stack_ffffffffffffff88);
    copy_iterable<std::vector<double,std::allocator<double>>,std::back_insert_iterator<std::vector<double,std::allocator<double>>>>
              (in_stack_ffffffffffffffb0,
               (back_insert_iterator<std::vector<double,_std::allocator<double>_>_> *)dest);
  }
  else {
    std::vector<double,_std::allocator<double>_>::size(&rho);
    in_stack_ffffffffffffff90 =
         std::back_inserter<std::vector<double,std::allocator<double>>>(in_stack_ffffffffffffff88);
    copy_iterable<std::vector<double,std::allocator<double>>,std::back_insert_iterator<std::vector<double,std::allocator<double>>>>
              (in_stack_ffffffffffffff90.container,
               (back_insert_iterator<std::vector<double,_std::allocator<double>_>_> *)dest);
  }
  std::make_pair<int&,std::vector<double,std::allocator<double>>&>
            ((int *)in_stack_ffffffffffffff98.container,in_stack_ffffffffffffff90.container);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_RDI);
  return dest;
}

Assistant:

std::pair<int,std::vector<double>> load_reference_density(ExchCXX::Spin s) {

  std::vector<double> ref_rho;
  int npts;

  if( s == ExchCXX::Spin::Polarized ) {
    npts = rho_polarized.size() / 2;
    copy_iterable( rho_polarized, std::back_inserter(ref_rho) );
  } else {
    npts = rho.size();
    copy_iterable( rho, std::back_inserter(ref_rho) );
  }
  return std::make_pair(npts, ref_rho);

}